

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O3

void __thiscall
DIntermissionScreenText::Init(DIntermissionScreenText *this,FIntermissionAction *desc,bool first)

{
  int iVar1;
  int iVar2;
  int iVar3;
  _func_int **__s;
  size_t sVar4;
  
  DIntermissionScreen::Init(&this->super_DIntermissionScreen,desc,first);
  __s = desc[1]._vptr_FIntermissionAction;
  this->mText = (char *)__s;
  if (*(char *)__s == '$') {
    __s = (_func_int **)FStringTable::operator()(&GStrings,(char *)((long)__s + 1));
    this->mText = (char *)__s;
  }
  iVar1 = *(int *)&desc[1].field_0xc;
  this->mTextSpeed = iVar1;
  iVar2 = *(int *)&desc[1].mClass;
  this->mTextX = iVar2;
  if (iVar2 < 0) {
    this->mTextX = gameinfo.TextScreenX;
  }
  iVar2 = *(int *)((long)&desc[1].mClass + 4);
  this->mTextY = iVar2;
  if (iVar2 < 0) {
    this->mTextY = gameinfo.TextScreenY;
  }
  sVar4 = strlen((char *)__s);
  this->mTextLen = (int)sVar4;
  iVar2 = desc[1].mSize;
  this->mTextDelay = iVar2;
  this->mTextColor = *(EColorRange *)&desc[1].mMusic.Chars;
  iVar3 = *(int *)&(this->super_DIntermissionScreen).super_DObject.field_0x24;
  if (0 < iVar3) {
    *(int *)&(this->super_DIntermissionScreen).super_DObject.field_0x24 =
         iVar2 + iVar3 + iVar1 * (int)sVar4;
  }
  return;
}

Assistant:

void DIntermissionScreenText::Init(FIntermissionAction *desc, bool first)
{
	Super::Init(desc, first);
	mText = static_cast<FIntermissionActionTextscreen*>(desc)->mText;
	if (mText[0] == '$') mText = GStrings(&mText[1]);
	mTextSpeed = static_cast<FIntermissionActionTextscreen*>(desc)->mTextSpeed;
	mTextX = static_cast<FIntermissionActionTextscreen*>(desc)->mTextX;
	if (mTextX < 0) mTextX =gameinfo.TextScreenX;
	mTextY = static_cast<FIntermissionActionTextscreen*>(desc)->mTextY;
	if (mTextY < 0) mTextY =gameinfo.TextScreenY;
	mTextLen = (int)strlen(mText);
	mTextDelay = static_cast<FIntermissionActionTextscreen*>(desc)->mTextDelay;
	mTextColor = static_cast<FIntermissionActionTextscreen*>(desc)->mTextColor;
	// For text screens, the duration only counts when the text is complete.
	if (mDuration > 0) mDuration += mTextDelay + mTextSpeed * mTextLen;
}